

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O1

void prf_nodeinfo_exit(void)

{
  prf_nodeinfo_t *ppVar1;
  prf_nodeinfo_t **pppVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = prf_array_count(nodetypes);
  pppVar2 = nodetypes;
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      ppVar1 = pppVar2[uVar4];
      if (ppVar1 != (prf_nodeinfo_t *)0x0) {
        free(ppVar1->name);
        free(pppVar2[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  prf_array_free(nodetypes);
  nodetypes = (prf_nodeinfo_t **)0x0;
  return;
}

Assistant:

void
prf_nodeinfo_exit(
    void )
{
    int i, count;
    count = prf_array_count(nodetypes);
    for ( i = 0; i < count; i++ ) {
        if ( nodetypes[i] != NULL ) {
            free(nodetypes[i]->name);
            free(nodetypes[i]);
        }
    }
    prf_array_free(nodetypes);
    nodetypes = NULL;
}